

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

int __thiscall llvm::StringRef::compare(StringRef *this,StringRef RHS)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong Length;
  
  uVar3 = RHS.Length;
  Length = this->Length;
  if (uVar3 <= this->Length) {
    Length = uVar3;
  }
  iVar1 = compareMemory(this->Data,RHS.Data,Length);
  if (iVar1 == 0) {
    if (this->Length == uVar3) {
      return 0;
    }
    uVar2 = -(uint)(this->Length < uVar3);
  }
  else {
    uVar2 = iVar1 >> 0x1f;
  }
  return uVar2 | 1;
}

Assistant:

LLVM_NODISCARD
    int compare(StringRef RHS) const {
      // Check the prefix for a mismatch.
      if (int Res = compareMemory(Data, RHS.Data, std::min(Length, RHS.Length)))
        return Res < 0 ? -1 : 1;

      // Otherwise the prefixes match, so we only need to check the lengths.
      if (Length == RHS.Length)
        return 0;
      return Length < RHS.Length ? -1 : 1;
    }